

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsWindowWithinBeginStackOf(ImGuiWindow *window,ImGuiWindow *potential_parent)

{
  bool bVar1;
  
  if (window->RootWindow == potential_parent) {
    bVar1 = true;
  }
  else {
    for (; (bVar1 = window != (ImGuiWindow *)0x0, window != potential_parent &&
           (window != (ImGuiWindow *)0x0)); window = window->ParentWindowInBeginStack) {
    }
  }
  return bVar1;
}

Assistant:

bool ImGui::IsWindowWithinBeginStackOf(ImGuiWindow* window, ImGuiWindow* potential_parent)
{
    if (window->RootWindow == potential_parent)
        return true;
    while (window != NULL)
    {
        if (window == potential_parent)
            return true;
        window = window->ParentWindowInBeginStack;
    }
    return false;
}